

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O2

uint nsvg__parseColor(char *str)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  int b;
  int g;
  int r;
  char s1 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  do {
    pcVar5 = str;
    cVar1 = *pcVar5;
    str = pcVar5 + 1;
  } while (cVar1 == ' ');
  sVar4 = strlen(pcVar5);
  if (cVar1 == '#' && sVar4 != 0) {
    s1._0_8_ = (ulong)(uint)s1._4_4_ << 0x20;
    lVar7 = 0;
    while ((str[lVar7] != '\0' && (iVar2 = nsvg__isspace(str[lVar7]), iVar2 == 0))) {
      lVar7 = lVar7 + 1;
    }
    if ((int)lVar7 == 3) {
      __isoc99_sscanf(str,"%x",s1);
      uVar3 = ((s1._0_4_ & 0xf00) << 8 | (s1._0_4_ & 0xf0) << 4 | s1._0_4_ & 0xf) * 0x11;
    }
    else {
      uVar3 = 0;
      if ((int)lVar7 == 6) {
        __isoc99_sscanf(str,"%x",s1);
        uVar3 = s1._0_4_;
      }
    }
    uVar3 = (uVar3 & 0xff) << 0x10 | uVar3 & 0xff00 | uVar3 >> 0x10 & 0xff;
  }
  else if ((((cVar1 == 'r' && 3 < sVar4) && (*str == 'g')) && (pcVar5[2] == 'b')) &&
          (pcVar5[3] == '(')) {
    r = -1;
    g = -1;
    b = -1;
    s1[0x10] = '\0';
    s1[0x11] = '\0';
    s1[0x12] = '\0';
    s1[0x13] = '\0';
    s1[0x14] = '\0';
    s1[0x15] = '\0';
    s1[0x16] = '\0';
    s1[0x17] = '\0';
    s1[0x18] = '\0';
    s1[0x19] = '\0';
    s1[0x1a] = '\0';
    s1[0x1b] = '\0';
    s1[0x1c] = '\0';
    s1[0x1d] = '\0';
    s1[0x1e] = '\0';
    s1[0x1f] = '\0';
    s1[0] = '\0';
    s1[1] = '\0';
    s1[2] = '\0';
    s1[3] = '\0';
    s1[4] = '\0';
    s1[5] = '\0';
    s1[6] = '\0';
    s1[7] = '\0';
    s1[8] = '\0';
    s1[9] = '\0';
    s1[10] = '\0';
    s1[0xb] = '\0';
    s1[0xc] = '\0';
    s1[0xd] = '\0';
    s1[0xe] = '\0';
    s1[0xf] = '\0';
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    __isoc99_sscanf(pcVar5 + 4,"%d%[%%, \t]%d%[%%, \t]%d",&r,s1,&g,&local_48,&b);
    pcVar5 = strchr(s1,0x25);
    if (pcVar5 == (char *)0x0) {
      uVar3 = g << 8 | r;
    }
    else {
      uVar3 = (uint)(g * 0xff) / 100 << 8 | (uint)(r * 0xff) / 100;
      b = (uint)(b * 0xff) / 100;
    }
    uVar3 = b << 0x10 | uVar3;
  }
  else {
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      if (lVar6 + 0x10 == 0xb0) {
        return 0x808080;
      }
      iVar2 = strcmp(*(char **)((long)&nsvg__colors[0].name + lVar6),pcVar5);
      lVar7 = lVar6 + 0x10;
    } while (iVar2 != 0);
    uVar3 = *(uint *)((long)&nsvg__colors[0].color + lVar6);
  }
  return uVar3;
}

Assistant:

static unsigned int nsvg__parseColor(const char* str)
{
	size_t len = 0;
	while(*str == ' ') ++str;
	len = strlen(str);
	if (len >= 1 && *str == '#')
		return nsvg__parseColorHex(str);
	else if (len >= 4 && str[0] == 'r' && str[1] == 'g' && str[2] == 'b' && str[3] == '(')
		return nsvg__parseColorRGB(str);
	return nsvg__parseColorName(str);
}